

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

char * BinaryCache::GetBytecode(char *path)

{
  uint uVar1;
  char *pcVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 == lastHash) {
    puVar3 = &lastBytecode;
LAB_00123c67:
    pcVar2 = (char *)*puVar3;
  }
  else {
    uVar4 = (ulong)DAT_0022727c;
    if (uVar4 == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      puVar3 = (undefined8 *)(cache + 0x10);
      pcVar2 = (char *)0x0;
      do {
        if (uVar1 == *(uint *)(puVar3 + -1)) goto LAB_00123c67;
        puVar3 = puVar3 + 5;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return pcVar2;
}

Assistant:

const char* BinaryCache::GetBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	if(hash == lastHash)
		return lastBytecode;

	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i != cache.size())
		return cache[i].binary;

	return NULL;
}